

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsScissorTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::Functional::anon_unknown_0::FramebufferClearCase::render
          (FramebufferClearCase *this,GLuint program)

{
  GLfloat *pGVar1;
  ClearType CVar2;
  glUniform4fvFunc p_Var3;
  int iVar4;
  GLint GVar5;
  undefined4 extraout_var;
  GLfloat *pGVar6;
  GLenum GVar7;
  int clearStencil;
  GLfloat local_70;
  GLfloat local_6c [9];
  Vec3 local_48;
  Vec3 local_38;
  Functions *gl;
  
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar4);
  CVar2 = this->m_clearType;
  pGVar1 = local_6c + 2;
  if (CVar2 == CLEAR_COLOR_FLOAT) {
switchD_0049ca45_caseD_0:
    GVar7 = 0x1800;
    pGVar6 = pGVar1;
LAB_0049c92f:
    local_6c[5] = 1.0;
    local_6c[4] = 0.5;
    local_6c[3] = 1.0;
    local_6c[2] = 1.0;
    local_6c[1] = 0.0;
    local_6c[0] = 1.7236e-43;
    local_70 = 0.5;
    (*gl->clearBufferfv)(GVar7,0,pGVar6);
    goto switchD_0049ca45_caseD_1;
  }
  if (CVar2 == CLEAR_COLOR_UINT) {
    local_6c[1] = 2.8026e-45;
    local_6c[2] = 3.57331e-43;
    local_6c[3] = 3.57331e-43;
    local_6c[4] = 0.0;
    local_6c[5] = 3.57331e-43;
    local_6c[0] = 1.7236e-43;
    local_70 = 0.5;
    (*gl->clearBufferuiv)(0x1800,0,(GLuint *)pGVar1);
    goto switchD_0049ca45_caseD_1;
  }
  if (CVar2 == CLEAR_COLOR_INT) {
    local_6c[1] = 1.4013e-45;
    local_6c[2] = 1.77965e-43;
    local_6c[3] = -NAN;
    local_6c[4] = 0.0;
    local_6c[5] = 1.77965e-43;
    GVar7 = 0x1800;
    pGVar6 = pGVar1;
LAB_0049c8c1:
    local_6c[0] = 1.7236e-43;
    local_70 = 0.5;
    (*gl->clearBufferiv)(GVar7,0,(GLint *)pGVar6);
  }
  else {
    local_6c[1] = 0.0;
    local_6c[2] = 1.0;
    local_6c[3] = 1.0;
    local_6c[4] = 0.5;
    local_6c[5] = 1.0;
    local_6c[0] = 1.7236e-43;
    local_70 = 0.5;
    switch(CVar2) {
    case CLEAR_COLOR_FIXED:
      goto switchD_0049ca45_caseD_0;
    case CLEAR_DEPTH:
      pGVar6 = &local_70;
      GVar7 = 0x1801;
      goto LAB_0049c92f;
    case CLEAR_STENCIL:
      pGVar6 = local_6c;
      GVar7 = 0x1802;
      goto LAB_0049c8c1;
    case CLEAR_DEPTH_STENCIL:
      (*gl->clearBufferfi)(0x84f9,0,0.5,0x7b);
    }
  }
switchD_0049ca45_caseD_1:
  CVar2 = this->m_clearType;
  if (CVar2 - CLEAR_STENCIL < 2) {
    GVar7 = 0xb90;
    if (CVar2 == CLEAR_DEPTH_STENCIL) {
      (*gl->enable)(0xb71);
    }
  }
  else {
    GVar7 = 0xb71;
    if (CVar2 != CLEAR_DEPTH) {
      return;
    }
  }
  (*gl->enable)(GVar7);
  (*gl->stencilFunc)(0x202,0x7b,0xffffffff);
  (*gl->depthFunc)(0x204);
  (*gl->disable)(0xc11);
  p_Var3 = gl->uniform4fv;
  GVar5 = (*gl->getUniformLocation)(program,"u_color");
  (*p_Var3)(GVar5,1,pGVar1);
  local_38.m_data[0] = -1.0;
  local_38.m_data[1] = -1.0;
  local_38.m_data[2] = 0.6;
  local_48.m_data[0] = 1.0;
  local_48.m_data[1] = 1.0;
  local_48.m_data[2] = 0.6;
  drawQuad(gl,program,&local_38,&local_48);
  return;
}

Assistant:

void FramebufferClearCase::render (GLuint program) const
{
	const glw::Functions&	gl					= m_renderCtx.getFunctions();

	const BufferFmtDesc		bufferFmt			= getBufferFormat(m_clearType);
	const Color				clearColor			= getMainColor(bufferFmt);

	const int				clearStencil		= 123;
	const float				clearDepth			= 0.5f;

	switch (m_clearType)
	{
		case CLEAR_COLOR_FIXED:		gl.clearBufferfv (GL_COLOR, 0, clearColor.f);						break;
		case CLEAR_COLOR_FLOAT:		gl.clearBufferfv (GL_COLOR, 0, clearColor.f);						break;
		case CLEAR_COLOR_INT:		gl.clearBufferiv (GL_COLOR, 0, clearColor.i);						break;
		case CLEAR_COLOR_UINT:		gl.clearBufferuiv(GL_COLOR, 0, clearColor.u);						break;
		case CLEAR_DEPTH:			gl.clearBufferfv (GL_DEPTH, 0, &clearDepth);						break;
		case CLEAR_STENCIL:			gl.clearBufferiv (GL_STENCIL, 0, &clearStencil);					break;
		case CLEAR_DEPTH_STENCIL:	gl.clearBufferfi (GL_DEPTH_STENCIL, 0, clearDepth, clearStencil);	break;

		default:
			DE_ASSERT(false);
	}

	const bool useDepth		= (m_clearType == CLEAR_DEPTH   || m_clearType == CLEAR_DEPTH_STENCIL);
	const bool useStencil	= (m_clearType == CLEAR_STENCIL || m_clearType == CLEAR_DEPTH_STENCIL);

	// Render something to expose changes to depth/stencil buffer
	if (useDepth || useStencil)
	{
		if (useDepth)
			gl.enable(GL_DEPTH_TEST);

		if (useStencil)
			gl.enable(GL_STENCIL_TEST);

		gl.stencilFunc(GL_EQUAL, clearStencil, ~0u);
		gl.depthFunc(GL_GREATER);
		gl.disable(GL_SCISSOR_TEST);

		gl.uniform4fv(gl.getUniformLocation(program, "u_color"), 1, clearColor.f);
		drawQuad(gl, program, tcu::Vec3(-1.0f, -1.0f, 0.6f), tcu::Vec3(1.0f, 1.0f, 0.6f));
	}
}